

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

String __thiscall xmrig::OclLib::getString(OclLib *this,cl_kernel kernel,cl_kernel_info param_name)

{
  cl_int cVar1;
  char *str;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String SVar3;
  size_t size;
  size_t local_30;
  
  local_30 = 0;
  cVar1 = getKernelInfo(kernel,param_name,0,(void *)0x0,&local_30);
  sVar2 = local_30;
  if (cVar1 == 0) {
    str = (char *)operator_new__(local_30);
    memset(str,0,sVar2);
    getKernelInfo(kernel,param_name,sVar2,str,(size_t *)0x0);
    String::String((String *)this,str);
    sVar2 = extraout_RDX_00;
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    sVar2 = extraout_RDX;
  }
  SVar3.m_size = sVar2;
  SVar3.m_data = (char *)this;
  return SVar3;
}

Assistant:

xmrig::String xmrig::OclLib::getString(cl_kernel kernel, cl_kernel_info param_name) noexcept
{
    return getOclString(OclLib::getKernelInfo, kernel, param_name);
}